

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgenericitemmodel.cpp
# Opt level: O1

bool __thiscall
QGenericItemModel::setItemData(QGenericItemModel *this,QModelIndex *index,QMap<int,_QVariant> *data)

{
  long in_FS_OFFSET;
  bool ret;
  undefined1 local_11;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  local_11 = 0;
  (**(code **)(*(long *)(this + 0x10) + 8))(2,*(long *)(this + 0x10),&local_11);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return (bool)local_11;
  }
  __stack_chk_fail();
}

Assistant:

bool QGenericItemModel::setItemData(const QModelIndex &index, const QMap<int, QVariant> &data)
{
    return impl->call<bool>(QGenericItemModelImplBase::SetItemData, index, data);
}